

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

bool __thiscall
vkt::sr::(anonymous_namespace)::TextureGatherInstance::
verify<tcu::TextureCubeView,tcu::Vector<float,3>>
          (TextureGatherInstance *this,ConstPixelBufferAccess *rendered,TextureCubeView *texture,
          Vector<float,_3> (*texCoords) [4],GatherArgs *gatherArgs)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float width;
  long lVar4;
  PixelOffsets *pPVar5;
  bool bVar6;
  VkPhysicalDeviceProperties *pVVar7;
  ulong uVar8;
  string *psVar9;
  ConstPixelBufferAccess *pCVar10;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int iVar12;
  ChannelOrder CVar13;
  float z;
  IVec2 *offsetRange;
  void *data;
  undefined8 data_00;
  int px;
  ChannelOrder CVar14;
  ChannelOrder CVar15;
  float y;
  bool bVar16;
  int px_2;
  int iVar17;
  uint uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Vector<float,_3> VVar30;
  Vector<bool,_4> res_1;
  Vector<float,_3> texCoord_2;
  Vector<float,_3> texCoord;
  Surface errorMask_1;
  Surface ideal;
  Surface errorMask;
  Vec4 resultPix;
  IVec2 offsets [4];
  TextureLevel ideal_1;
  Vec4 idealPix;
  PixelBufferAccess idealAccess;
  IVec4 colorBits;
  undefined1 local_378 [8];
  TextureFormat TStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  TestLog *local_350;
  float local_348;
  float local_344;
  undefined1 local_340 [8];
  TextureFormat local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  ConstPixelBufferAccess *local_320;
  undefined1 local_318 [8];
  TextureFormat TStack_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [2];
  Surface local_2e8;
  string local_2d0;
  Sampler *local_2b0;
  string local_2a8;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [6];
  float local_1f8;
  ChannelType CStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  LogImage local_1e8;
  TextureLevel local_158;
  Vector<float,_3> (*local_130) [4];
  undefined1 local_128 [8];
  undefined8 uStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  undefined1 local_f8 [24];
  TextureFormat local_e0;
  undefined8 uStack_d8;
  BVec4 local_d0;
  float fStack_cc;
  MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
  local_c8;
  Sampler local_b8;
  IVec4 local_78 [4];
  
  local_350 = (*(Context **)(this + 8))->m_testCtx->m_log;
  uVar29 = *(uint *)(this + 0x210);
  iVar17 = *(int *)(this + 0x214);
  local_320 = rendered;
  local_2b0 = (Sampler *)texture;
  local_130 = texCoords;
  pVVar7 = Context::getDeviceProperties(*(Context **)(this + 8));
  if (iVar17 == 0) {
    offsetRange = (IVec2 *)0x0;
    uVar18 = 0;
  }
  else if (iVar17 == 2) {
    uVar18 = (pVVar7->limits).minTexelGatherOffset;
    offsetRange = (IVec2 *)(ulong)(pVVar7->limits).maxTexelGatherOffset;
  }
  else if (iVar17 == 1) {
    offsetRange = (IVec2 *)0x7;
    uVar18 = 0xfffffff8;
  }
  else {
    uVar18 = 0xffffffff;
    offsetRange = (IVec2 *)0xffffffff;
  }
  sr::anon_unknown_0::makePixelOffsetsFunctor
            (&local_c8,(anon_unknown_0 *)(ulong)uVar29,(GatherType)gatherArgs,
             (GatherArgs *)(ulong)uVar18,offsetRange);
  pPVar5 = local_c8.
           super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
           .m_data.ptr;
  local_78[0].m_data[0] = 7;
  local_78[0].m_data[1] = 7;
  local_78[0].m_data[2] = 7;
  local_78[0].m_data[3] = 7;
  uVar8 = (ulong)*(uint *)(this + 0x250);
  CVar14 = ~R;
  iVar17 = -1;
  iVar12 = -1;
  iVar19 = -1;
  if (uVar8 < 3) {
    CVar14 = *(ChannelOrder *)(&DAT_00af9610 + uVar8 * 4);
    iVar17 = *(int *)(&DAT_00af961c + uVar8 * 4);
    iVar12 = *(int *)(&DAT_00af9628 + uVar8 * 4);
    iVar19 = *(int *)(&DAT_00af9634 + uVar8 * 4);
  }
  local_b8.wrapR = WRAPMODE_LAST;
  local_b8.minFilter = FILTERMODE_LAST;
  local_b8.magFilter = FILTERMODE_LAST;
  local_b8.lodThreshold = 0.0;
  local_b8.normalizedCoords = true;
  local_b8.depthStencilMode = MODE_DEPTH;
  local_b8._32_8_ = 0;
  local_b8.borderColor.v._4_5_ = 0;
  local_b8.borderColor.v.uData[2]._1_3_ = 0;
  local_b8._48_5_ = 0;
  local_b8._0_8_ = *(undefined8 *)(this + 0x224);
  local_b8.compare = *(CompareMode *)(this + 0x220);
  if ((*(int *)(this + 0x218) == 0x14) || (*(int *)(this + 0x218) == 0x12)) {
    local_158.m_format.type = CVar14;
    local_158.m_format.order = CVar14;
    local_158.m_size.m_data[1] = iVar12;
    local_158.m_size.m_data[0] = iVar17;
    local_158.m_data.m_ptr = (void *)0x1000000010;
    local_158._20_4_ = iVar19;
    local_158.m_size.m_data[2] = iVar12;
    local_158.m_data.m_cap._0_4_ = 7;
    local_2e8._0_8_ = &PTR_operator___00cf8270;
    local_2e8.m_pixels.m_ptr = (void *)0x4000000040;
    CVar14 = (local_320->m_size).m_data[0];
    tcu::Surface::Surface((Surface *)&local_2d0,CVar14,CVar14);
    local_1e8.m_name._M_dataplus._M_p = (pointer)0x300000008;
    data = (void *)CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                            local_2d0.field_2._M_allocated_capacity._0_6_);
    if ((void *)CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                         local_2d0.field_2._M_allocated_capacity._0_6_) != (void *)0x0) {
      data = (void *)local_2d0._M_string_length;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_f8,(TextureFormat *)&local_1e8,
               (int)local_2d0._M_dataplus._M_p,local_2d0._M_dataplus._M_p._4_4_,1,data);
    tcu::Surface::Surface((Surface *)&local_2a8,CVar14,CVar14);
    local_288._0_4_ = RGBA;
    local_288._4_4_ = UNORM_INT8;
    data_00 = local_2a8.field_2._M_allocated_capacity;
    if ((void *)local_2a8.field_2._M_allocated_capacity != (void *)0x0) {
      data_00 = local_2a8._M_string_length;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_1e8,(TextureFormat *)local_288,
               (int)local_2a8._M_dataplus._M_p,local_2a8._M_dataplus._M_p._4_4_,1,(void *)data_00);
    local_128._0_4_ = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)local_128);
    tcu::clear((PixelBufferAccess *)&local_1e8,(Vec4 *)local_288);
    if ((int)CVar14 < 1) {
      bVar16 = true;
    }
    else {
      local_1f8 = (float)(int)CVar14;
      bVar16 = true;
      CVar13 = R;
      do {
        local_344 = ((float)(int)CVar13 + 0.5) / local_1f8;
        CVar15 = R;
        do {
          local_1e8.m_name.field_2._M_allocated_capacity = 0;
          local_1e8.m_name.field_2._8_8_ = 0;
          local_1e8.m_name._M_dataplus._M_p = (pointer)0x0;
          local_1e8.m_name._M_string_length = 0;
          local_288._4_4_ = CVar13;
          local_288._0_4_ = CVar15;
          (**pPVar5->_vptr_PixelOffsets)(pPVar5,(ConstPixelBufferAccess *)local_288,&local_1e8);
          auVar26 = (undefined1  [12])0x0;
          VVar30 = triQuadInterpolate<tcu::Vector<float,3>>
                             ((_anonymous_namespace_ *)local_318,local_130,
                              ((float)(int)CVar15 + 0.5) / local_1f8,local_344);
          auVar24._0_4_ = VVar30.m_data[2];
          auVar24._4_12_ = auVar26;
          local_348 = (float)(**(code **)local_2e8._0_8_)
                                       (VVar30.m_data._0_8_,auVar24._0_8_,&local_2e8,
                                        (ConstPixelBufferAccess *)local_288);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_288,(int)local_320,CVar15,CVar13);
          tcu::TextureCubeView::gatherCompare
                    ((TextureCubeView *)local_128,local_2b0,local_348,(float)local_318._0_4_,
                     (float)local_318._4_4_,(float)TStack_310.order);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_f8,(Vec4 *)local_128,CVar15,CVar13,0);
          auVar20._4_4_ = -(uint)((float)local_128._4_4_ == (float)local_288._4_4_);
          auVar20._0_4_ = -(uint)((float)local_128._0_4_ == (float)local_288._0_4_);
          auVar20._8_4_ = -(uint)((float)uStack_120 == fStack_280);
          auVar20._12_4_ = -(uint)(uStack_120._4_4_ == fStack_27c);
          auVar20 = packssdw(auVar20,auVar20);
          auVar20 = packsswb(auVar20,auVar20);
          local_378._0_4_ = SUB164(auVar20 & _DAT_00a98960,0);
          if (SUB161(auVar20 & _DAT_00a98960,0) == '\0') {
LAB_0062481e:
            bVar6 = tcu::isGatherCompareResultValid
                              ((TextureCubeView *)local_2b0,&local_b8,
                               (TexComparePrecision *)&local_158,(Vec3 *)local_318,local_348,
                               (Vec4 *)local_288);
            if (!bVar6) {
              *(undefined4 *)
               (local_2a8._M_string_length +
               (long)(int)((int)local_2a8._M_dataplus._M_p * CVar13 + CVar15) * 4) = 0xff0000ff;
              bVar16 = false;
            }
          }
          else {
            uVar8 = 0xffffffffffffffff;
            do {
              if (uVar8 == 2) goto LAB_00624873;
              uVar1 = uVar8 + 1;
              lVar4 = uVar8 + 2;
              uVar8 = uVar1;
            } while (local_378[lVar4] != '\0');
            if (uVar1 < 3) goto LAB_0062481e;
          }
LAB_00624873:
          CVar15 = CVar15 + A;
        } while (CVar15 != CVar14);
        CVar13 = CVar13 + A;
      } while (CVar13 != CVar14);
    }
    local_118[0]._M_allocated_capacity = (ConstPixelBufferAccess *)0x6552796669726556;
    local_118[0]._8_4_ = 0x746c7573;
    uStack_120 = (ConstPixelBufferAccess *)0xc;
    local_118[0]._M_local_buf[0xc] = '\0';
    local_318 = (undefined1  [8])local_308;
    local_1e8.m_name._M_dataplus._M_p = (pointer)0x13;
    local_128 = (undefined1  [8])local_118;
    local_318 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_318,(ulong)&local_1e8);
    local_308[0]._M_allocated_capacity = local_1e8.m_name._M_dataplus._M_p;
    *(undefined8 *)local_318 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_318 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_318 + 0xf),"sult",4);
    TStack_310 = (TextureFormat)local_1e8.m_name._M_dataplus._M_p;
    *(char *)((long)local_318 + (long)local_1e8.m_name._M_dataplus._M_p) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_288,(string *)local_128,(string *)local_318);
    tcu::TestLog::startImageSet(local_350,(char *)local_288,local_268._M_p);
    local_368._M_allocated_capacity._0_4_ = 0x646e6552;
    local_368._M_allocated_capacity._4_4_ = 0x64657265;
    TStack_370.order = RGBA;
    TStack_370.type = SNORM_INT8;
    local_368._8_2_ = (ushort)(byte)local_368._M_local_buf[9] << 8;
    local_330._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_330._M_allocated_capacity._6_2_ = 0x6465;
    local_330._M_local_buf[8] = ' ';
    local_330._M_local_buf[9] = 'i';
    local_330._10_4_ = 0x6567616d;
    local_338.order = sRGB;
    local_338.type = SNORM_INT8;
    local_330._M_local_buf[0xe] = '\0';
    pCVar10 = local_320;
    local_378 = (undefined1  [8])&local_368;
    local_340 = (undefined1  [8])&local_330;
    tcu::LogImage::LogImage
              (&local_1e8,(string *)local_378,(string *)local_340,local_320,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_1e8,(int)local_350,__buf,(size_t)pCVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_description._M_dataplus._M_p != &local_1e8.m_description.field_2) {
      operator_delete(local_1e8.m_description._M_dataplus._M_p,
                      local_1e8.m_description.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_1e8.m_name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8.m_name._M_dataplus._M_p,
                      local_1e8.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_340 != (undefined1  [8])&local_330) {
      operator_delete((void *)local_340,
                      CONCAT26(local_330._M_allocated_capacity._6_2_,
                               local_330._M_allocated_capacity._0_6_) + 1);
    }
    if (local_378 != (undefined1  [8])&local_368) {
      operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != local_258) {
      operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
    }
    if (local_288 != (undefined1  [8])&local_278) {
      operator_delete((void *)local_288,(ulong)(local_278._M_allocated_capacity + 1));
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
    }
    if (local_128 != (undefined1  [8])local_118) {
      operator_delete((void *)local_128,(ulong)(local_118[0]._M_allocated_capacity + 1));
    }
    if (!bVar16) {
      local_118[0]._M_allocated_capacity = (ConstPixelBufferAccess *)0x636e657265666552;
      local_118[0]._8_2_ = 0x65;
      uStack_120 = (ConstPixelBufferAccess *)0x9;
      local_318 = (undefined1  [8])local_308;
      local_288._0_4_ = CHANNELORDER_LAST;
      local_288._4_4_ = SNORM_INT8;
      local_128 = (undefined1  [8])local_118;
      local_318 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_318,(ulong)local_288);
      local_308[0]._M_allocated_capacity = local_288;
      *(undefined8 *)local_318 = 0x6572206c61656449;
      builtin_strncpy((char *)((long)local_318 + 8),"ference ",8);
      builtin_strncpy((char *)((long)local_318 + 0xd),"ce image",8);
      TStack_310.order = local_288._0_4_;
      TStack_310.type = local_288._4_4_;
      *(char *)((long)local_318 + (long)local_288) = '\0';
      psVar9 = &local_2d0;
      tcu::LogImage::LogImage
                (&local_1e8,(string *)local_128,(string *)local_318,(Surface *)psVar9,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_1e8,(int)local_350,__buf_00,(size_t)psVar9);
      local_368._M_allocated_capacity._0_4_ = 0x6f727245;
      local_368._M_allocated_capacity._4_4_ = 0x73614d72;
      local_368._8_2_ = 0x6b;
      TStack_370.order = ARGB;
      TStack_370.type = SNORM_INT8;
      local_330._M_allocated_capacity._0_6_ = 0x20726f727245;
      local_330._M_allocated_capacity._6_2_ = 0x616d;
      local_330._M_local_buf[8] = 's';
      local_330._M_local_buf[9] = 'k';
      local_338.order = BGR;
      local_338.type = SNORM_INT8;
      local_330._10_4_ = local_330._10_4_ & 0xffffff00;
      psVar9 = &local_2a8;
      local_378 = (undefined1  [8])&local_368;
      local_340 = (undefined1  [8])&local_330;
      tcu::LogImage::LogImage
                ((LogImage *)local_288,(string *)local_378,(string *)local_340,(Surface *)psVar9,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_288,(int)local_350,__buf_01,(size_t)psVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_p != local_258) {
        operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
      }
      if (local_288 != (undefined1  [8])&local_278) {
        operator_delete((void *)local_288,(ulong)(local_278._M_allocated_capacity + 1));
      }
      if (local_340 != (undefined1  [8])&local_330) {
        operator_delete((void *)local_340,
                        CONCAT26(local_330._M_allocated_capacity._6_2_,
                                 local_330._M_allocated_capacity._0_6_) + 1);
      }
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_description._M_dataplus._M_p != &local_1e8.m_description.field_2) {
        operator_delete(local_1e8.m_description._M_dataplus._M_p,
                        local_1e8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e8.m_name._M_dataplus._M_p,
                        local_1e8.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
      }
      if (local_128 != (undefined1  [8])local_118) {
        operator_delete((void *)local_128,(ulong)(local_118[0]._M_allocated_capacity + 1));
      }
    }
    tcu::TestLog::endImageSet(local_350);
    tcu::Surface::~Surface((Surface *)&local_2a8);
    tcu::Surface::~Surface((Surface *)&local_2d0);
    goto LAB_00625d54;
  }
  local_348 = 0.0;
  if (0 < gatherArgs->componentNdx) {
    local_348 = (float)gatherArgs->componentNdx;
  }
  uVar29 = *(uint *)(this + 0x21c);
  uVar8 = (ulong)uVar29;
  if (uVar8 < 0x22) {
    if ((0x58UL >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x2c0000000U >> (uVar8 & 0x3f) & 1) == 0) goto LAB_0062589f;
      goto LAB_006248d2;
    }
    local_f8._0_4_ = DS|I;
    local_f8._4_4_ = UNSIGNED_INT_11F_11F_10F_REV;
    local_f8._8_4_ = 0x16;
    local_f8._12_4_ = 0x10;
    local_f8._16_4_ = 0x10;
    local_f8._20_4_ = 0x10;
    local_e0.order = R;
    local_e0.type = SNORM_INT8;
    uStack_d8 = (void *)0x0;
    local_d0.m_data[0] = true;
    local_d0.m_data[1] = true;
    local_d0.m_data[2] = true;
    local_d0.m_data[3] = true;
    tcu::computeFixedPointThreshold((tcu *)&local_1e8,local_78);
    pPVar5 = local_c8.
             super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
             .m_data.ptr;
    local_e0 = (TextureFormat)local_1e8.m_name._M_dataplus._M_p;
    uStack_d8 = (void *)local_1e8.m_name._M_string_length;
    local_f8._4_4_ = CVar14;
    local_f8._0_4_ = CVar14;
    local_f8._12_4_ = iVar12;
    local_f8._8_4_ = iVar17;
    local_f8._20_4_ = iVar19;
    local_f8._16_4_ = iVar12;
    local_d0.m_data[0] = true;
    local_d0.m_data[1] = true;
    local_d0.m_data[2] = true;
    local_d0.m_data[3] = true;
    CVar14 = (local_320->m_size).m_data[0];
    tcu::TextureLevel::TextureLevel(&local_158,&local_320->m_format,CVar14,CVar14,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_128,&local_158);
    tcu::Surface::Surface(&local_2e8,CVar14,CVar14);
    local_288._0_4_ = RGBA;
    local_288._4_4_ = UNORM_INT8;
    if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
      local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_1e8,(TextureFormat *)local_288,local_2e8.m_width,
               local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
    local_318._0_4_ = -1.7146522e+38;
    tcu::RGBA::toVec((RGBA *)local_318);
    tcu::clear((PixelBufferAccess *)&local_1e8,(Vec4 *)local_288);
    if ((int)CVar14 < 1) {
      bVar16 = true;
    }
    else {
      local_1f8 = (float)(int)CVar14;
      bVar16 = true;
      CVar13 = R;
      do {
        local_344 = ((float)(int)CVar13 + 0.5) / local_1f8;
        CVar15 = R;
        do {
          local_1e8.m_name.field_2._M_allocated_capacity = 0;
          local_1e8.m_name.field_2._8_8_ = 0;
          local_1e8.m_name._M_dataplus._M_p = (pointer)0x0;
          local_1e8.m_name._M_string_length = 0;
          local_288._4_4_ = CVar13;
          local_288._0_4_ = CVar15;
          (**pPVar5->_vptr_PixelOffsets)(pPVar5,(TextureCubeView *)local_288,&local_1e8);
          triQuadInterpolate<tcu::Vector<float,3>>
                    ((_anonymous_namespace_ *)local_340,local_130,
                     ((float)(int)CVar15 + 0.5) / local_1f8,local_344);
          tcu::ConstPixelBufferAccess::getPixelT<float>
                    ((ConstPixelBufferAccess *)local_318,(int)local_320,CVar15,CVar13);
          tcu::TextureCubeView::gather
                    ((TextureCubeView *)local_288,local_2b0,(float)local_340._0_4_,
                     (float)local_340._4_4_,(float)local_338.order,(int)&local_b8);
          TStack_370.order = (ChannelOrder)fStack_280;
          TStack_370.type = (ChannelType)fStack_27c;
          local_378 = local_288;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_128,(Vec4 *)local_378,CVar15,CVar13,0);
          auVar22._4_4_ =
               -(uint)((float)local_e0.type <
                      (float)(~-(uint)((float)local_378._4_4_ < (float)local_318._4_4_) &
                              (uint)((float)local_378._4_4_ - (float)local_318._4_4_) |
                             (uint)((float)local_318._4_4_ - (float)local_378._4_4_) &
                             -(uint)((float)local_378._4_4_ < (float)local_318._4_4_)));
          auVar22._0_4_ =
               -(uint)((float)local_e0.order <
                      (float)(~-(uint)((float)local_378._0_4_ < (float)local_318._0_4_) &
                              (uint)((float)local_378._0_4_ - (float)local_318._0_4_) |
                             (uint)((float)local_318._0_4_ - (float)local_378._0_4_) &
                             -(uint)((float)local_378._0_4_ < (float)local_318._0_4_)));
          auVar22._8_4_ =
               -(uint)((float)uStack_d8 <
                      (float)(~-(uint)((float)TStack_370.order < (float)TStack_310.order) &
                              (uint)((float)TStack_370.order - (float)TStack_310.order) |
                             (uint)((float)TStack_310.order - (float)TStack_370.order) &
                             -(uint)((float)TStack_370.order < (float)TStack_310.order)));
          auVar22._12_4_ =
               -(uint)(uStack_d8._4_4_ <
                      (float)(~-(uint)((float)TStack_370.type < (float)TStack_310.type) &
                              (uint)((float)TStack_370.type - (float)TStack_310.type) |
                             (uint)((float)TStack_310.type - (float)TStack_370.type) &
                             -(uint)((float)TStack_370.type < (float)TStack_310.type)));
          auVar20 = packssdw(auVar22,auVar22);
          auVar20 = packsswb(auVar20,auVar20);
          auVar25._4_4_ = fStack_cc;
          auVar25[0] = local_d0.m_data[0];
          auVar25[1] = local_d0.m_data[1];
          auVar25[2] = local_d0.m_data[2];
          auVar25[3] = local_d0.m_data[3];
          auVar25._8_8_ = 0;
          auVar20 = auVar25 & auVar20 & _DAT_00a98960;
          uVar29 = auVar20._0_4_;
          if ((((auVar20[0] != '\0') || ((uVar29 >> 8 & 1) != 0)) ||
              (((uVar29 >> 0x10 & 1) != 0 || ((uVar29 >> 0x18 & 1) != 0)))) &&
             (bVar6 = tcu::isGatherResultValid
                                ((TextureCubeView *)local_2b0,&local_b8,(LookupPrecision *)local_f8,
                                 (Vec3 *)local_340,(int)local_348,(Vec4 *)local_318), !bVar6)) {
            *(undefined4 *)
             ((long)local_2e8.m_pixels.m_ptr + (long)(int)(local_2e8.m_width * CVar13 + CVar15) * 4)
                 = 0xff0000ff;
            bVar16 = false;
          }
          CVar15 = CVar15 + A;
        } while (CVar14 != CVar15);
        CVar13 = CVar13 + A;
      } while (CVar13 != CVar14);
    }
    local_308[0]._0_4_ = 0x69726556;
    local_308[0]._4_4_ = 0x65527966;
    local_308[0]._8_4_ = 0x746c7573;
    TStack_310.order = sR;
    TStack_310.type = SNORM_INT8;
    local_308[0]._M_local_buf[0xc] = '\0';
    local_378 = (undefined1  [8])&local_368;
    local_1e8.m_name._M_dataplus._M_p = (pointer)0x13;
    local_318 = (undefined1  [8])local_308;
    local_378 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_378,(ulong)&local_1e8);
    local_368._M_allocated_capacity = (size_type)local_1e8.m_name._M_dataplus._M_p;
    *(undefined8 *)local_378 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_378 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_378 + 0xf),"sult",4);
    TStack_370 = (TextureFormat)local_1e8.m_name._M_dataplus._M_p;
    *(char *)((long)local_378 + (long)local_1e8.m_name._M_dataplus._M_p) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_288,(string *)local_318,(string *)local_378);
    tcu::TestLog::startImageSet(local_350,(char *)local_288,local_268._M_p);
    local_330._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_330._M_allocated_capacity._6_2_ = 0x6465;
    local_338.order = RGBA;
    local_338.type = SNORM_INT8;
    local_330._M_local_buf[8] = '\0';
    paVar2 = &local_2d0.field_2;
    local_2d0.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_2d0.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_2d0.field_2._8_2_ = 0x6920;
    local_2d0.field_2._10_4_ = 0x6567616d;
    local_2d0._M_string_length = 0xe;
    local_2d0.field_2._M_local_buf[0xe] = '\0';
    pCVar10 = local_320;
    local_340 = (undefined1  [8])&local_330;
    local_2d0._M_dataplus._M_p = (pointer)paVar2;
    tcu::LogImage::LogImage
              (&local_1e8,(string *)local_340,&local_2d0,local_320,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_1e8,(int)local_350,__buf_02,(size_t)pCVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_description._M_dataplus._M_p != &local_1e8.m_description.field_2) {
      operator_delete(local_1e8.m_description._M_dataplus._M_p,
                      local_1e8.m_description.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_1e8.m_name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_1e8.m_name._M_dataplus._M_p,
                      local_1e8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2d0._M_dataplus._M_p,
                      CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                               local_2d0.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if (local_340 != (undefined1  [8])&local_330) {
      operator_delete((void *)local_340,
                      CONCAT26(local_330._M_allocated_capacity._6_2_,
                               local_330._M_allocated_capacity._0_6_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != local_258) {
      operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
    }
    if (local_288 != (undefined1  [8])&local_278) {
      operator_delete((void *)local_288,(ulong)(local_278._M_allocated_capacity + 1));
    }
    if (local_378 != (undefined1  [8])&local_368) {
      operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
    }
    if (!bVar16) {
      local_378 = (undefined1  [8])&local_368;
      local_368._M_allocated_capacity._0_4_ = 0x65666552;
      local_368._M_allocated_capacity._4_4_ = 0x636e6572;
      local_368._8_2_ = 0x65;
      TStack_370.order = ARGB;
      TStack_370.type = SNORM_INT8;
      local_288._0_4_ = CHANNELORDER_LAST;
      local_288._4_4_ = SNORM_INT8;
      local_340 = (undefined1  [8])&local_330;
      local_340 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_288);
      local_330._M_allocated_capacity._0_6_ = local_288._0_6_;
      local_330._M_allocated_capacity._6_2_ = local_288._6_2_;
      *(undefined8 *)local_340 = 0x6572206c61656449;
      *(char *)((long)local_340 + 8) = 'f';
      *(char *)((long)local_340 + 9) = 'e';
      *(char *)((long)local_340 + 10) = 'r';
      *(char *)((long)local_340 + 0xb) = 'e';
      *(char *)((long)local_340 + 0xc) = 'n';
      *(char *)((long)local_340 + 0xd) = 'c';
      *(char *)((long)local_340 + 0xe) = 'e';
      *(char *)((long)local_340 + 0xf) = ' ';
      *(char *)((long)local_340 + 0xd) = 'c';
      *(char *)((long)local_340 + 0xe) = 'e';
      *(char *)((long)local_340 + 0xf) = ' ';
      *(char *)((long)local_340 + 0x10) = 'i';
      *(char *)((long)local_340 + 0x11) = 'm';
      *(char *)((long)local_340 + 0x12) = 'a';
      *(char *)((long)local_340 + 0x13) = 'g';
      *(char *)((long)local_340 + 0x14) = 'e';
      local_338.order = local_288._0_4_;
      local_338.type = local_288._4_4_;
      *(char *)((long)local_340 + (long)local_288) = '\0';
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_318,&local_158);
      pCVar10 = (ConstPixelBufferAccess *)local_318;
      tcu::LogImage::LogImage
                (&local_1e8,(string *)local_378,(string *)local_340,pCVar10,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_1e8,(int)local_350,__buf_03,(size_t)pCVar10);
      local_2d0.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
      local_2d0.field_2._M_allocated_capacity._6_2_ = 0x7361;
      local_2d0.field_2._8_2_ = 0x6b;
      local_2d0._M_string_length = 9;
      local_2a8.field_2._M_allocated_capacity = 0x616d20726f727245;
      local_2a8.field_2._8_2_ = 0x6b73;
      local_2a8._M_string_length = 10;
      local_2a8.field_2._M_local_buf[10] = '\0';
      pSVar11 = &local_2e8;
      local_2d0._M_dataplus._M_p = (pointer)paVar2;
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      tcu::LogImage::LogImage
                ((LogImage *)local_288,&local_2d0,&local_2a8,pSVar11,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_288,(int)local_350,__buf_04,(size_t)pSVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_p != local_258) {
        operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
      }
      if (local_288 != (undefined1  [8])&local_278) {
        operator_delete((void *)local_288,(ulong)(local_278._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                                 local_2d0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_description._M_dataplus._M_p != &local_1e8.m_description.field_2) {
        operator_delete(local_1e8.m_description._M_dataplus._M_p,
                        local_1e8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_name._M_dataplus._M_p != paVar3) {
        operator_delete(local_1e8.m_name._M_dataplus._M_p,
                        local_1e8.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_340 != (undefined1  [8])&local_330) {
        operator_delete((void *)local_340,
                        CONCAT26(local_330._M_allocated_capacity._6_2_,
                                 local_330._M_allocated_capacity._0_6_) + 1);
      }
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
      }
    }
    tcu::TestLog::endImageSet(local_350);
  }
  else {
LAB_0062589f:
    if (2 < uVar29 - 0x1b) {
LAB_00626052:
      bVar16 = false;
      goto LAB_00625d54;
    }
LAB_006248d2:
    local_e0.order = R;
    local_e0.type = SNORM_INT8;
    uStack_d8 = (void *)0x0;
    local_f8._4_4_ = CVar14;
    local_f8._0_4_ = CVar14;
    local_f8._12_4_ = iVar12;
    local_f8._8_4_ = iVar17;
    local_f8._20_4_ = iVar19;
    local_f8._16_4_ = iVar12;
    local_d0.m_data[0] = true;
    local_d0.m_data[1] = true;
    local_d0.m_data[2] = true;
    local_d0.m_data[3] = true;
    if ((uVar29 < 0x22) && ((0x2c0000000U >> ((ulong)uVar29 & 0x3f) & 1) != 0)) {
      width = (float)(local_320->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel(&local_158,&local_320->m_format,(int)width,(int)width,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_128,&local_158);
      tcu::Surface::Surface(&local_2e8,(int)width,(int)width);
      local_288._0_4_ = RGBA;
      local_288._4_4_ = UNORM_INT8;
      if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
        local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_1e8,(TextureFormat *)local_288,local_2e8.m_width,
                 local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
      local_318._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_318);
      tcu::clear((PixelBufferAccess *)&local_1e8,(Vec4 *)local_288);
      if ((int)width < 1) {
        bVar16 = true;
      }
      else {
        local_344 = (float)(int)width;
        bVar16 = true;
        z = 0.0;
        do {
          fStack_cc = ((float)(int)z + 0.5) / local_344;
          y = 0.0;
          do {
            local_1e8.m_name.field_2._M_allocated_capacity = 0;
            local_1e8.m_name.field_2._8_8_ = 0;
            local_1e8.m_name._M_dataplus._M_p = (pointer)0x0;
            local_1e8.m_name._M_string_length = 0;
            local_288._0_4_ = y;
            local_288._4_4_ = z;
            (**pPVar5->_vptr_PixelOffsets)(pPVar5,(TextureCubeView *)local_288,&local_1e8);
            triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)local_378,local_130,
                       ((float)(int)y + 0.5) / local_344,fStack_cc);
            tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)local_318,(int)local_320,(int)y,(int)z);
            tcu::TextureCubeView::gather
                      ((TextureCubeView *)local_288,local_2b0,(float)local_378._0_4_,
                       (float)local_378._4_4_,(float)TStack_370.order,(int)&local_b8);
            local_1f8 = (float)((int)((float)local_288._0_4_ - 2.1474836e+09) &
                                (int)(float)local_288._0_4_ >> 0x1f | (int)(float)local_288._0_4_);
            CStack_1f4 = (int)((float)local_288._4_4_ - 2.1474836e+09) &
                         (int)(float)local_288._4_4_ >> 0x1f | (int)(float)local_288._4_4_;
            fStack_280 = (float)((int)(fStack_280 - 2.1474836e+09) & (int)fStack_280 >> 0x1f |
                                (int)fStack_280);
            fStack_27c = (float)((int)(fStack_27c - 2.1474836e+09) & (int)fStack_27c >> 0x1f |
                                (int)fStack_27c);
            local_288._4_4_ = CStack_1f4;
            local_288._0_4_ = local_1f8;
            fStack_1f0 = fStack_280;
            fStack_1ec = fStack_27c;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_128,(IVec4 *)local_288,(int)y,(int)z,0);
            uVar29 = -(uint)((int)(CStack_1f4 ^ 0x80000000) < (int)-(float)local_318._4_4_);
            auVar27._0_4_ =
                 -(uint)((int)-(float)local_e0.order <
                        (int)(-(uint)((int)-local_1f8 < (int)-(float)local_318._0_4_) -
                              (local_318._0_4_ - (int)local_1f8 ^
                              -(uint)((int)-local_1f8 < (int)-(float)local_318._0_4_)) ^ 0x80000000)
                        );
            auVar27._4_4_ =
                 -(uint)((int)-(float)local_e0.type <
                        (int)(uVar29 - (local_318._4_4_ - CStack_1f4 ^ uVar29) ^ 0x80000000));
            auVar27._8_4_ =
                 -(uint)((int)-(float)uStack_d8 <
                        (int)(-(uint)((int)-fStack_1f0 < (int)-(float)TStack_310.order) -
                              (TStack_310.order - (int)fStack_1f0 ^
                              -(uint)((int)-fStack_1f0 < (int)-(float)TStack_310.order)) ^
                             0x80000000));
            auVar27._12_4_ =
                 -(uint)((int)-uStack_d8._4_4_ <
                        (int)(-(uint)((int)-fStack_1ec < (int)-(float)TStack_310.type) -
                              (TStack_310.type - (int)fStack_1ec ^
                              -(uint)((int)-fStack_1ec < (int)-(float)TStack_310.type)) ^ 0x80000000
                             ));
            auVar20 = packssdw(auVar27,auVar27);
            auVar20 = packsswb(auVar20,auVar20);
            auVar21._4_4_ = fStack_cc;
            auVar21[0] = local_d0.m_data[0];
            auVar21[1] = local_d0.m_data[1];
            auVar21[2] = local_d0.m_data[2];
            auVar21[3] = local_d0.m_data[3];
            auVar21._8_8_ = 0;
            auVar20 = auVar21 & auVar20 & _DAT_00a98960;
            uVar29 = auVar20._0_4_;
            if ((((auVar20[0] != '\0') || ((uVar29 >> 8 & 1) != 0)) ||
                (((uVar29 >> 0x10 & 1) != 0 || ((uVar29 >> 0x18 & 1) != 0)))) &&
               (bVar6 = tcu::isGatherResultValid
                                  ((TextureCubeView *)local_2b0,&local_b8,
                                   (IntLookupPrecision *)local_f8,(Vec3 *)local_378,(int)local_348,
                                   (UVec4 *)local_318), !bVar6)) {
              *(undefined4 *)
               ((long)local_2e8.m_pixels.m_ptr + (long)(local_2e8.m_width * (int)z + (int)y) * 4) =
                   0xff0000ff;
              bVar16 = false;
            }
            y = (float)((int)y + 1);
          } while (width != y);
          z = (float)((int)z + 1);
        } while (z != width);
      }
      local_308[0]._0_4_ = 0x69726556;
      local_308[0]._4_4_ = 0x65527966;
      local_308[0]._8_4_ = 0x746c7573;
      TStack_310.order = sR;
      TStack_310.type = SNORM_INT8;
      local_308[0]._M_local_buf[0xc] = '\0';
      local_378 = (undefined1  [8])&local_368;
      local_1e8.m_name._M_dataplus._M_p = (pointer)0x13;
      local_318 = (undefined1  [8])local_308;
      local_378 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_378,(ulong)&local_1e8);
      local_368._M_allocated_capacity = (size_type)local_1e8.m_name._M_dataplus._M_p;
      *(undefined8 *)local_378 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_378 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_378 + 0xf),"sult",4);
      TStack_370 = (TextureFormat)local_1e8.m_name._M_dataplus._M_p;
      *(char *)((long)local_378 + (long)local_1e8.m_name._M_dataplus._M_p) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_288,(string *)local_318,(string *)local_378);
      tcu::TestLog::startImageSet(local_350,(char *)local_288,local_268._M_p);
      local_330._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_330._M_allocated_capacity._6_2_ = 0x6465;
      local_338.order = RGBA;
      local_338.type = SNORM_INT8;
      local_330._M_local_buf[8] = '\0';
      paVar2 = &local_2d0.field_2;
      local_2d0.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_2d0.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_2d0.field_2._8_2_ = 0x6920;
      local_2d0.field_2._10_4_ = 0x6567616d;
      local_2d0._M_string_length = 0xe;
      local_2d0.field_2._M_local_buf[0xe] = '\0';
      pCVar10 = local_320;
      local_340 = (undefined1  [8])&local_330;
      local_2d0._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogImage::LogImage
                (&local_1e8,(string *)local_340,&local_2d0,local_320,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write(&local_1e8,(int)local_350,__buf_05,(size_t)pCVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_description._M_dataplus._M_p != &local_1e8.m_description.field_2) {
        operator_delete(local_1e8.m_description._M_dataplus._M_p,
                        local_1e8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_name._M_dataplus._M_p != &local_1e8.m_name.field_2) {
        operator_delete(local_1e8.m_name._M_dataplus._M_p,
                        local_1e8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                                 local_2d0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_340 != (undefined1  [8])&local_330) {
        operator_delete((void *)local_340,
                        CONCAT26(local_330._M_allocated_capacity._6_2_,
                                 local_330._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_p != local_258) {
        operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
      }
      if (local_288 != (undefined1  [8])&local_278) {
        operator_delete((void *)local_288,(ulong)(local_278._M_allocated_capacity + 1));
      }
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
      }
      if (!bVar16) {
        local_378 = (undefined1  [8])&local_368;
        local_368._M_allocated_capacity._0_4_ = 0x65666552;
        local_368._M_allocated_capacity._4_4_ = 0x636e6572;
        local_368._8_2_ = 0x65;
        TStack_370.order = ARGB;
        TStack_370.type = SNORM_INT8;
        local_288._0_4_ = CHANNELORDER_LAST;
        local_288._4_4_ = SNORM_INT8;
        local_340 = (undefined1  [8])&local_330;
        local_340 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_288);
        local_330._M_allocated_capacity._0_6_ = local_288._0_6_;
        local_330._M_allocated_capacity._6_2_ = local_288._6_2_;
        *(undefined8 *)local_340 = 0x6572206c61656449;
        *(char *)((long)local_340 + 8) = 'f';
        *(char *)((long)local_340 + 9) = 'e';
        *(char *)((long)local_340 + 10) = 'r';
        *(char *)((long)local_340 + 0xb) = 'e';
        *(char *)((long)local_340 + 0xc) = 'n';
        *(char *)((long)local_340 + 0xd) = 'c';
        *(char *)((long)local_340 + 0xe) = 'e';
        *(char *)((long)local_340 + 0xf) = ' ';
        *(char *)((long)local_340 + 0xd) = 'c';
        *(char *)((long)local_340 + 0xe) = 'e';
        *(char *)((long)local_340 + 0xf) = ' ';
        *(char *)((long)local_340 + 0x10) = 'i';
        *(char *)((long)local_340 + 0x11) = 'm';
        *(char *)((long)local_340 + 0x12) = 'a';
        *(char *)((long)local_340 + 0x13) = 'g';
        *(char *)((long)local_340 + 0x14) = 'e';
        local_338.order = local_288._0_4_;
        local_338.type = local_288._4_4_;
        *(char *)((long)local_340 + (long)local_288) = '\0';
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_318,&local_158);
        pCVar10 = (ConstPixelBufferAccess *)local_318;
        tcu::LogImage::LogImage
                  (&local_1e8,(string *)local_378,(string *)local_340,pCVar10,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_1e8,(int)local_350,__buf_06,(size_t)pCVar10);
        local_2d0.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_2d0.field_2._M_allocated_capacity._6_2_ = 0x7361;
        local_2d0.field_2._8_2_ = 0x6b;
        local_2d0._M_string_length = 9;
        local_2a8.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_2a8.field_2._8_2_ = 0x6b73;
        local_2a8._M_string_length = 10;
        local_2a8.field_2._M_local_buf[10] = '\0';
        pSVar11 = &local_2e8;
        local_2d0._M_dataplus._M_p = (pointer)paVar2;
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        tcu::LogImage::LogImage
                  ((LogImage *)local_288,&local_2d0,&local_2a8,pSVar11,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_288,(int)local_350,__buf_07,(size_t)pSVar11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_p != local_258) {
          operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
        }
        if (local_288 != (undefined1  [8])&local_278) {
          operator_delete((void *)local_288,(ulong)(local_278._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != paVar2) {
          operator_delete(local_2d0._M_dataplus._M_p,
                          CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                                   local_2d0.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.m_description._M_dataplus._M_p != &local_1e8.m_description.field_2) {
          operator_delete(local_1e8.m_description._M_dataplus._M_p,
                          local_1e8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.m_name._M_dataplus._M_p != &local_1e8.m_name.field_2) {
          operator_delete(local_1e8.m_name._M_dataplus._M_p,
                          local_1e8.m_name.field_2._M_allocated_capacity + 1);
        }
        if (local_340 != (undefined1  [8])&local_330) {
          operator_delete((void *)local_340,
                          CONCAT26(local_330._M_allocated_capacity._6_2_,
                                   local_330._M_allocated_capacity._0_6_) + 1);
        }
        if (local_378 != (undefined1  [8])&local_368) {
          operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet(local_350);
    }
    else {
      if (2 < uVar29 - 0x1b) goto LAB_00626052;
      CVar14 = (local_320->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel(&local_158,&local_320->m_format,CVar14,CVar14,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_128,&local_158);
      tcu::Surface::Surface(&local_2e8,CVar14,CVar14);
      local_288._0_4_ = RGBA;
      local_288._4_4_ = UNORM_INT8;
      if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
        local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_1e8,(TextureFormat *)local_288,local_2e8.m_width,
                 local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
      local_318._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_318);
      tcu::clear((PixelBufferAccess *)&local_1e8,(Vec4 *)local_288);
      if ((int)CVar14 < 1) {
        bVar16 = true;
      }
      else {
        local_1f8 = (float)(int)CVar14;
        bVar16 = true;
        CVar13 = R;
        do {
          local_344 = ((float)(int)CVar13 + 0.5) / local_1f8;
          CVar15 = R;
          do {
            local_1e8.m_name.field_2._M_allocated_capacity = 0;
            local_1e8.m_name.field_2._8_8_ = 0;
            local_1e8.m_name._M_dataplus._M_p = (pointer)0x0;
            local_1e8.m_name._M_string_length = 0;
            local_288._4_4_ = CVar13;
            local_288._0_4_ = CVar15;
            (**pPVar5->_vptr_PixelOffsets)(pPVar5,(TextureCubeView *)local_288,&local_1e8);
            triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)local_340,local_130,
                       ((float)(int)CVar15 + 0.5) / local_1f8,local_344);
            tcu::ConstPixelBufferAccess::getPixelT<int>
                      ((ConstPixelBufferAccess *)local_318,(int)local_320,CVar15,CVar13);
            tcu::TextureCubeView::gather
                      ((TextureCubeView *)local_288,local_2b0,(float)local_340._0_4_,
                       (float)local_340._4_4_,(float)local_338.order,(int)&local_b8);
            local_378._4_4_ = (int)(float)local_288._4_4_;
            local_378._0_4_ = (int)(float)local_288._0_4_;
            TStack_370.type = (int)fStack_27c;
            TStack_370.order = (int)fStack_280;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_128,(IVec4 *)local_378,CVar15,CVar13,0);
            auVar28._0_4_ =
                 -(uint)((int)local_e0.order <
                        (int)(-(uint)((int)local_378._0_4_ < (int)local_318._0_4_) -
                             (local_318._0_4_ - local_378._0_4_ ^
                             -(uint)((int)local_378._0_4_ < (int)local_318._0_4_))));
            auVar28._4_4_ =
                 -(uint)((int)local_e0.type <
                        (int)(-(uint)((int)local_378._4_4_ < (int)local_318._4_4_) -
                             (local_318._4_4_ - local_378._4_4_ ^
                             -(uint)((int)local_378._4_4_ < (int)local_318._4_4_))));
            auVar28._8_4_ =
                 -(uint)((int)(float)uStack_d8 <
                        (int)(-(uint)((int)TStack_370.order < (int)TStack_310.order) -
                             (TStack_310.order - TStack_370.order ^
                             -(uint)((int)TStack_370.order < (int)TStack_310.order))));
            auVar28._12_4_ =
                 -(uint)((int)uStack_d8._4_4_ <
                        (int)(-(uint)((int)TStack_370.type < (int)TStack_310.type) -
                             (TStack_310.type - TStack_370.type ^
                             -(uint)((int)TStack_370.type < (int)TStack_310.type))));
            auVar20 = packssdw(auVar28,auVar28);
            auVar20 = packsswb(auVar20,auVar20);
            auVar23._4_4_ = fStack_cc;
            auVar23[0] = local_d0.m_data[0];
            auVar23[1] = local_d0.m_data[1];
            auVar23[2] = local_d0.m_data[2];
            auVar23[3] = local_d0.m_data[3];
            auVar23._8_8_ = 0;
            auVar20 = auVar23 & auVar20 & _DAT_00a98960;
            uVar29 = auVar20._0_4_;
            if (((((auVar20[0] != '\0') || ((uVar29 >> 8 & 1) != 0)) || ((uVar29 >> 0x10 & 1) != 0))
                || ((uVar29 >> 0x18 & 1) != 0)) &&
               (bVar6 = tcu::isGatherResultValid
                                  ((TextureCubeView *)local_2b0,&local_b8,
                                   (IntLookupPrecision *)local_f8,(Vec3 *)local_340,(int)local_348,
                                   (IVec4 *)local_318), !bVar6)) {
              *(undefined4 *)
               ((long)local_2e8.m_pixels.m_ptr +
               (long)(int)(local_2e8.m_width * CVar13 + CVar15) * 4) = 0xff0000ff;
              bVar16 = false;
            }
            CVar15 = CVar15 + A;
          } while (CVar14 != CVar15);
          CVar13 = CVar13 + A;
        } while (CVar13 != CVar14);
      }
      local_308[0]._0_4_ = 0x69726556;
      local_308[0]._4_4_ = 0x65527966;
      local_308[0]._8_4_ = 0x746c7573;
      TStack_310.order = sR;
      TStack_310.type = SNORM_INT8;
      local_308[0]._M_local_buf[0xc] = '\0';
      local_378 = (undefined1  [8])&local_368;
      local_1e8.m_name._M_dataplus._M_p = (pointer)0x13;
      local_318 = (undefined1  [8])local_308;
      local_378 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_378,(ulong)&local_1e8);
      local_368._M_allocated_capacity = (size_type)local_1e8.m_name._M_dataplus._M_p;
      *(undefined8 *)local_378 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_378 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_378 + 0xf),"sult",4);
      TStack_370 = (TextureFormat)local_1e8.m_name._M_dataplus._M_p;
      *(char *)((long)local_378 + (long)local_1e8.m_name._M_dataplus._M_p) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_288,(string *)local_318,(string *)local_378);
      tcu::TestLog::startImageSet(local_350,(char *)local_288,local_268._M_p);
      local_330._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_330._M_allocated_capacity._6_2_ = 0x6465;
      local_338.order = RGBA;
      local_338.type = SNORM_INT8;
      local_330._M_local_buf[8] = '\0';
      paVar2 = &local_2d0.field_2;
      local_2d0.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_2d0.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_2d0.field_2._8_2_ = 0x6920;
      local_2d0.field_2._10_4_ = 0x6567616d;
      local_2d0._M_string_length = 0xe;
      local_2d0.field_2._M_local_buf[0xe] = '\0';
      pCVar10 = local_320;
      local_340 = (undefined1  [8])&local_330;
      local_2d0._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogImage::LogImage
                (&local_1e8,(string *)local_340,&local_2d0,local_320,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write(&local_1e8,(int)local_350,__buf_08,(size_t)pCVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_description._M_dataplus._M_p != &local_1e8.m_description.field_2) {
        operator_delete(local_1e8.m_description._M_dataplus._M_p,
                        local_1e8.m_description.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_1e8.m_name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_name._M_dataplus._M_p != paVar3) {
        operator_delete(local_1e8.m_name._M_dataplus._M_p,
                        local_1e8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                                 local_2d0.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_340 != (undefined1  [8])&local_330) {
        operator_delete((void *)local_340,
                        CONCAT26(local_330._M_allocated_capacity._6_2_,
                                 local_330._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_p != local_258) {
        operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
      }
      if (local_288 != (undefined1  [8])&local_278) {
        operator_delete((void *)local_288,(ulong)(local_278._M_allocated_capacity + 1));
      }
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
      }
      if (!bVar16) {
        local_378 = (undefined1  [8])&local_368;
        local_368._M_allocated_capacity._0_4_ = 0x65666552;
        local_368._M_allocated_capacity._4_4_ = 0x636e6572;
        local_368._8_2_ = 0x65;
        TStack_370.order = ARGB;
        TStack_370.type = SNORM_INT8;
        local_288._0_4_ = CHANNELORDER_LAST;
        local_288._4_4_ = SNORM_INT8;
        local_340 = (undefined1  [8])&local_330;
        local_340 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_288);
        local_330._M_allocated_capacity._0_6_ = local_288._0_6_;
        local_330._M_allocated_capacity._6_2_ = local_288._6_2_;
        *(undefined8 *)local_340 = 0x6572206c61656449;
        *(char *)((long)local_340 + 8) = 'f';
        *(char *)((long)local_340 + 9) = 'e';
        *(char *)((long)local_340 + 10) = 'r';
        *(char *)((long)local_340 + 0xb) = 'e';
        *(char *)((long)local_340 + 0xc) = 'n';
        *(char *)((long)local_340 + 0xd) = 'c';
        *(char *)((long)local_340 + 0xe) = 'e';
        *(char *)((long)local_340 + 0xf) = ' ';
        *(char *)((long)local_340 + 0xd) = 'c';
        *(char *)((long)local_340 + 0xe) = 'e';
        *(char *)((long)local_340 + 0xf) = ' ';
        *(char *)((long)local_340 + 0x10) = 'i';
        *(char *)((long)local_340 + 0x11) = 'm';
        *(char *)((long)local_340 + 0x12) = 'a';
        *(char *)((long)local_340 + 0x13) = 'g';
        *(char *)((long)local_340 + 0x14) = 'e';
        local_338.order = local_288._0_4_;
        local_338.type = local_288._4_4_;
        *(char *)((long)local_340 + (long)local_288) = '\0';
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_318,&local_158);
        pCVar10 = (ConstPixelBufferAccess *)local_318;
        tcu::LogImage::LogImage
                  (&local_1e8,(string *)local_378,(string *)local_340,pCVar10,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_1e8,(int)local_350,__buf_09,(size_t)pCVar10);
        local_2d0.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_2d0.field_2._M_allocated_capacity._6_2_ = 0x7361;
        local_2d0.field_2._8_2_ = 0x6b;
        local_2d0._M_string_length = 9;
        local_2a8.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_2a8.field_2._8_2_ = 0x6b73;
        local_2a8._M_string_length = 10;
        local_2a8.field_2._M_local_buf[10] = '\0';
        pSVar11 = &local_2e8;
        local_2d0._M_dataplus._M_p = (pointer)paVar2;
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        tcu::LogImage::LogImage
                  ((LogImage *)local_288,&local_2d0,&local_2a8,pSVar11,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_288,(int)local_350,__buf_10,(size_t)pSVar11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_p != local_258) {
          operator_delete(local_268._M_p,(ulong)(local_258[0]._M_allocated_capacity + 1));
        }
        if (local_288 != (undefined1  [8])&local_278) {
          operator_delete((void *)local_288,(ulong)(local_278._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != paVar2) {
          operator_delete(local_2d0._M_dataplus._M_p,
                          CONCAT26(local_2d0.field_2._M_allocated_capacity._6_2_,
                                   local_2d0.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.m_description._M_dataplus._M_p != &local_1e8.m_description.field_2) {
          operator_delete(local_1e8.m_description._M_dataplus._M_p,
                          local_1e8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.m_name._M_dataplus._M_p != paVar3) {
          operator_delete(local_1e8.m_name._M_dataplus._M_p,
                          local_1e8.m_name.field_2._M_allocated_capacity + 1);
        }
        if (local_340 != (undefined1  [8])&local_330) {
          operator_delete((void *)local_340,
                          CONCAT26(local_330._M_allocated_capacity._6_2_,
                                   local_330._M_allocated_capacity._0_6_) + 1);
        }
        if (local_378 != (undefined1  [8])&local_368) {
          operator_delete((void *)local_378,local_368._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet(local_350);
    }
  }
  tcu::Surface::~Surface(&local_2e8);
  tcu::TextureLevel::~TextureLevel(&local_158);
LAB_00625d54:
  if (local_c8.
      super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
      .m_data.ptr != (PixelOffsets *)0x0) {
    (*(local_c8.
       super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
       .m_data.ptr)->_vptr_PixelOffsets[2])();
  }
  return bVar16;
}

Assistant:

bool TextureGatherInstance::verify (const ConstPixelBufferAccess&	rendered,
								const TexViewT&					texture,
								const TexCoordT					(&texCoords)[4],
								const GatherArgs&				gatherArgs) const
{
	TestLog& log = m_context.getTestContext().getLog();

	{
		DE_ASSERT(m_colorBufferFormat.order == tcu::TextureFormat::RGBA);
		DE_ASSERT(m_colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8);

		const MovePtr<PixelOffsets>		pixelOffsets	= makePixelOffsetsFunctor(m_baseParams.gatherType, gatherArgs, getOffsetRange(m_baseParams.offsetSize, m_context.getDeviceProperties().limits));
		const tcu::PixelFormat			pixelFormat		= tcu::PixelFormat(8,8,8,8);
		const IVec4						colorBits		= tcu::max(TextureTestUtil::getBitsVec(pixelFormat) - 1, tcu::IVec4(0));
		const IVec3						coordBits		= m_baseParams.textureType == TEXTURETYPE_2D			? IVec3(20,20,0)
														: m_baseParams.textureType == TEXTURETYPE_CUBE			? IVec3(10,10,10)
														: m_baseParams.textureType == TEXTURETYPE_2D_ARRAY		? IVec3(20,20,20)
														: IVec3(-1);
		const IVec3						uvwBits			= m_baseParams.textureType == TEXTURETYPE_2D			? IVec3(7,7,0)
														: m_baseParams.textureType == TEXTURETYPE_CUBE			? IVec3(6,6,0)
														: m_baseParams.textureType == TEXTURETYPE_2D_ARRAY		? IVec3(7,7,7)
														: IVec3(-1);
		tcu::Sampler					sampler;
		sampler.wrapS		= m_baseParams.wrapS;
		sampler.wrapT		= m_baseParams.wrapT;
		sampler.compare		= m_baseParams.shadowCompareMode;

		if (isDepthFormat(m_baseParams.textureFormat))
		{
			tcu::TexComparePrecision comparePrec;
			comparePrec.coordBits		= coordBits;
			comparePrec.uvwBits			= uvwBits;
			comparePrec.referenceBits	= 16;
			comparePrec.resultBits		= pixelFormat.redBits-1;

			return verifyGatherOffsetsCompare(log, rendered, texture, texCoords, sampler, comparePrec, PixelCompareRefZDefault(RENDER_SIZE), *pixelOffsets);
		}
		else
		{
			const int componentNdx = de::max(0, gatherArgs.componentNdx);

			if (isUnormFormatType(m_baseParams.textureFormat.type))
			{
				tcu::LookupPrecision lookupPrec;
				lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(colorBits);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= TextureTestUtil::getCompareMask(pixelFormat);
				return verifyGatherOffsets<float>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
			}
			else if (isUIntFormatType(m_baseParams.textureFormat.type) || isSIntFormatType(m_baseParams.textureFormat.type))
			{
				tcu::IntLookupPrecision		lookupPrec;
				lookupPrec.colorThreshold	= UVec4(0);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= TextureTestUtil::getCompareMask(pixelFormat);

				if (isUIntFormatType(m_baseParams.textureFormat.type))
					return verifyGatherOffsets<deUint32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else if (isSIntFormatType(m_baseParams.textureFormat.type))
					return verifyGatherOffsets<deInt32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else
				{
					DE_ASSERT(false);
					return false;
				}
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}
		}
	}
}